

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceIntersectorK<8>_>,_false>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive *prim;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [32];
  ulong *puVar17;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 aVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  Precalculations pre;
  vint8 bi;
  vbool<8> valid0;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_59b9;
  RayK<8> *local_59b8;
  RayK<8> *local_59b0;
  Primitive *local_59a8;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_59a0;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5980;
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  float local_58a0;
  float fStack_589c;
  float fStack_5898;
  float fStack_5894;
  float fStack_5890;
  float fStack_588c;
  float fStack_5888;
  int iStack_5884;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  int iStack_5864;
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  int iStack_5844;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5840;
  undefined8 local_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5808[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_5808[0] != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar19 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar20 = ZEXT816(0) << 0x40;
      auVar8 = vpcmpeqd_avx2(auVar19,(undefined1  [32])valid_i->field_0);
      auVar19 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar20),5);
      auVar7 = auVar8 & auVar19;
      if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar7 >> 0x7f,0) != '\0') ||
            (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar7 >> 0xbf,0) != '\0') ||
          (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar7[0x1f] < '\0')
      {
        local_59b8 = ray + 0x100;
        auVar19 = vandps_avx(auVar19,auVar8);
        auVar4 = vpackssdw_avx(auVar19._0_16_,auVar19._16_16_);
        auVar28._8_4_ = 0x7fffffff;
        auVar28._0_8_ = 0x7fffffff7fffffff;
        auVar28._12_4_ = 0x7fffffff;
        auVar28._16_4_ = 0x7fffffff;
        auVar28._20_4_ = 0x7fffffff;
        auVar28._24_4_ = 0x7fffffff;
        auVar28._28_4_ = 0x7fffffff;
        auVar19 = vandps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar28);
        auVar32._8_4_ = 0x219392ef;
        auVar32._0_8_ = 0x219392ef219392ef;
        auVar32._12_4_ = 0x219392ef;
        auVar32._16_4_ = 0x219392ef;
        auVar32._20_4_ = 0x219392ef;
        auVar32._24_4_ = 0x219392ef;
        auVar32._28_4_ = 0x219392ef;
        auVar19 = vcmpps_avx(auVar19,auVar32,1);
        auVar7 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar32,auVar19);
        auVar19 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar28);
        auVar19 = vcmpps_avx(auVar19,auVar32,1);
        auVar8 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar32,auVar19);
        auVar19 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar28);
        auVar19 = vcmpps_avx(auVar19,auVar32,1);
        auVar28 = vrcpps_avx(auVar7);
        auVar19 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar32,auVar19);
        auVar26._8_4_ = 0x3f800000;
        auVar26._0_8_ = 0x3f8000003f800000;
        auVar26._12_4_ = 0x3f800000;
        auVar26._16_4_ = 0x3f800000;
        auVar26._20_4_ = 0x3f800000;
        auVar26._24_4_ = 0x3f800000;
        auVar26._28_4_ = 0x3f800000;
        auVar32 = vrcpps_avx(auVar8);
        auVar9 = vfnmadd213ps_fma(auVar7,auVar28,auVar26);
        auVar6 = vrcpps_avx(auVar19);
        auVar10 = vfnmadd213ps_fma(auVar8,auVar32,auVar26);
        auVar11 = vfnmadd213ps_fma(auVar19,auVar6,auVar26);
        auVar19 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(auVar20));
        local_5960 = vpmovsxwd_avx2(auVar4);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar38 = ZEXT3264(local_4680);
        local_5940 = vblendvps_avx(local_4680,auVar19,local_5960);
        auVar5 = vpcmpeqd_avx(auVar19._0_16_,auVar19._0_16_);
        auVar19 = *(undefined1 (*) [32])ray;
        auVar7 = vpmovsxwd_avx2(auVar4 ^ auVar5);
        auVar37 = ZEXT3264(auVar7);
        auVar7 = *(undefined1 (*) [32])(ray + 0x40);
        auVar8 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar20));
        auVar21._8_4_ = 0xff800000;
        auVar21._0_8_ = 0xff800000ff800000;
        auVar21._12_4_ = 0xff800000;
        auVar21._16_4_ = 0xff800000;
        auVar21._20_4_ = 0xff800000;
        auVar21._24_4_ = 0xff800000;
        auVar21._28_4_ = 0xff800000;
        local_59a0 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)
                     vblendvps_avx(auVar21,auVar8,local_5960);
        auVar36 = ZEXT3264(local_5940);
        auVar20 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar32,auVar32);
        auVar34 = ZEXT1664(auVar20);
        auVar4 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar28,auVar28);
        auVar33 = ZEXT1664(auVar4);
        auVar5 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar6,auVar6);
        auVar35 = ZEXT1664(auVar5);
        puVar17 = local_5808 + 1;
        local_5810 = 0xfffffffffffffff8;
        pauVar16 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5940;
        local_5860 = auVar4._0_4_ * -auVar19._0_4_;
        fStack_585c = auVar4._4_4_ * -auVar19._4_4_;
        fStack_5858 = auVar4._8_4_ * -auVar19._8_4_;
        fStack_5854 = auVar4._12_4_ * -auVar19._12_4_;
        fStack_5850 = -auVar19._16_4_ * 0.0;
        fStack_584c = -auVar19._20_4_ * 0.0;
        iStack_5884 = local_59a0.i[7];
        fStack_5848 = -auVar19._24_4_ * 0.0;
        local_5880 = auVar20._0_4_ * -*(float *)(ray + 0x20);
        fStack_587c = auVar20._4_4_ * -*(float *)(ray + 0x24);
        fStack_5878 = auVar20._8_4_ * -*(float *)(ray + 0x28);
        fStack_5874 = auVar20._12_4_ * -*(float *)(ray + 0x2c);
        fStack_5870 = -*(float *)(ray + 0x30) * 0.0;
        fStack_586c = -*(float *)(ray + 0x34) * 0.0;
        fStack_5868 = -*(float *)(ray + 0x38) * 0.0;
        local_58a0 = auVar5._0_4_ * -auVar7._0_4_;
        fStack_589c = auVar5._4_4_ * -auVar7._4_4_;
        fStack_5898 = auVar5._8_4_ * -auVar7._8_4_;
        fStack_5894 = auVar5._12_4_ * -auVar7._12_4_;
        fStack_5890 = -auVar7._16_4_ * 0.0;
        fStack_588c = -auVar7._20_4_ * 0.0;
        fStack_5888 = -auVar7._24_4_ * 0.0;
        local_58e0 = ZEXT1632(auVar4);
        local_5900 = ZEXT1632(auVar20);
        local_5920 = ZEXT1632(auVar5);
        local_59b0 = ray;
        iStack_5864 = iStack_5884;
        iStack_5844 = iStack_5884;
LAB_016b2641:
        local_58c0 = auVar37._0_32_;
        puVar1 = puVar17 + -1;
        if (*puVar1 != 0xfffffffffffffff8) {
          puVar17 = puVar17 + -1;
          auVar19 = pauVar16[-1];
          pauVar16 = pauVar16 + -1;
          auVar7 = vcmpps_avx(auVar19,(undefined1  [32])local_59a0,1);
          uVar15 = *puVar1;
          if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar7 >> 0x7f,0) != '\0') ||
                (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar7 >> 0xbf,0) != '\0') ||
              (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar7[0x1f] < '\0') {
            do {
              if ((uVar15 & 8) != 0) {
                if (uVar15 == 0xfffffffffffffff8) goto LAB_016b28a1;
                auVar19 = vcmpps_avx((undefined1  [32])local_59a0,auVar19,6);
                if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar19 >> 0x7f,0) != '\0') ||
                      (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar19 >> 0xbf,0) != '\0') ||
                    (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar19[0x1f] < '\0') {
                  local_59a8 = (Primitive *)(uVar15 & 0xfffffffffffffff0);
                  aVar18 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)
                           (local_58c0 ^ _DAT_01f7b020);
                  lVar14 = (ulong)((uint)uVar15 & 0xf) - 7;
                  aVar22 = local_59a0;
                  goto LAB_016b27e3;
                }
                break;
              }
              uVar13 = 8;
              auVar19 = auVar38._0_32_;
              for (lVar14 = 0;
                  (lVar14 != 8 &&
                  (uVar3 = *(ulong *)((uVar15 & 0xfffffffffffffff0) + lVar14 * 8), uVar3 != 8));
                  lVar14 = lVar14 + 1) {
                uVar2 = *(undefined4 *)(uVar15 + 0x40 + lVar14 * 4);
                auVar24._4_4_ = uVar2;
                auVar24._0_4_ = uVar2;
                auVar24._8_4_ = uVar2;
                auVar24._12_4_ = uVar2;
                auVar24._16_4_ = uVar2;
                auVar24._20_4_ = uVar2;
                auVar24._24_4_ = uVar2;
                auVar24._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar15 + 0x80 + lVar14 * 4);
                auVar25._4_4_ = uVar2;
                auVar25._0_4_ = uVar2;
                auVar25._8_4_ = uVar2;
                auVar25._12_4_ = uVar2;
                auVar25._16_4_ = uVar2;
                auVar25._20_4_ = uVar2;
                auVar25._24_4_ = uVar2;
                auVar25._28_4_ = uVar2;
                auVar6._4_4_ = fStack_585c;
                auVar6._0_4_ = local_5860;
                auVar6._8_4_ = fStack_5858;
                auVar6._12_4_ = fStack_5854;
                auVar6._16_4_ = fStack_5850;
                auVar6._20_4_ = fStack_584c;
                auVar6._24_4_ = fStack_5848;
                auVar6._28_4_ = iStack_5844;
                auVar20 = vfmadd213ps_fma(auVar24,auVar33._0_32_,auVar6);
                auVar8._4_4_ = fStack_587c;
                auVar8._0_4_ = local_5880;
                auVar8._8_4_ = fStack_5878;
                auVar8._12_4_ = fStack_5874;
                auVar8._16_4_ = fStack_5870;
                auVar8._20_4_ = fStack_586c;
                auVar8._24_4_ = fStack_5868;
                auVar8._28_4_ = iStack_5864;
                auVar4 = vfmadd213ps_fma(auVar25,auVar34._0_32_,auVar8);
                uVar2 = *(undefined4 *)(uVar15 + 0xc0 + lVar14 * 4);
                auVar27._4_4_ = uVar2;
                auVar27._0_4_ = uVar2;
                auVar27._8_4_ = uVar2;
                auVar27._12_4_ = uVar2;
                auVar27._16_4_ = uVar2;
                auVar27._20_4_ = uVar2;
                auVar27._24_4_ = uVar2;
                auVar27._28_4_ = uVar2;
                auVar7._4_4_ = fStack_589c;
                auVar7._0_4_ = local_58a0;
                auVar7._8_4_ = fStack_5898;
                auVar7._12_4_ = fStack_5894;
                auVar7._16_4_ = fStack_5890;
                auVar7._20_4_ = fStack_588c;
                auVar7._24_4_ = fStack_5888;
                auVar7._28_4_ = iStack_5884;
                auVar5 = vfmadd213ps_fma(auVar27,auVar35._0_32_,auVar7);
                uVar2 = *(undefined4 *)(uVar15 + 0x60 + lVar14 * 4);
                auVar29._4_4_ = uVar2;
                auVar29._0_4_ = uVar2;
                auVar29._8_4_ = uVar2;
                auVar29._12_4_ = uVar2;
                auVar29._16_4_ = uVar2;
                auVar29._20_4_ = uVar2;
                auVar29._24_4_ = uVar2;
                auVar29._28_4_ = uVar2;
                auVar9 = vfmadd213ps_fma(auVar29,auVar33._0_32_,auVar6);
                uVar2 = *(undefined4 *)(uVar15 + 0xa0 + lVar14 * 4);
                auVar30._4_4_ = uVar2;
                auVar30._0_4_ = uVar2;
                auVar30._8_4_ = uVar2;
                auVar30._12_4_ = uVar2;
                auVar30._16_4_ = uVar2;
                auVar30._20_4_ = uVar2;
                auVar30._24_4_ = uVar2;
                auVar30._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar15 + 0xe0 + lVar14 * 4);
                auVar31._4_4_ = uVar2;
                auVar31._0_4_ = uVar2;
                auVar31._8_4_ = uVar2;
                auVar31._12_4_ = uVar2;
                auVar31._16_4_ = uVar2;
                auVar31._20_4_ = uVar2;
                auVar31._24_4_ = uVar2;
                auVar31._28_4_ = uVar2;
                auVar10 = vfmadd213ps_fma(auVar30,auVar34._0_32_,auVar8);
                auVar11 = vfmadd213ps_fma(auVar31,auVar35._0_32_,auVar7);
                auVar7 = vpminsd_avx2(ZEXT1632(auVar20),ZEXT1632(auVar9));
                auVar8 = vpminsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar10));
                auVar7 = vpmaxsd_avx2(auVar7,auVar8);
                auVar8 = vpminsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar11));
                auVar28 = vpmaxsd_avx2(auVar7,auVar8);
                auVar7 = vpmaxsd_avx2(ZEXT1632(auVar20),ZEXT1632(auVar9));
                auVar8 = vpmaxsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar10));
                auVar32 = vpminsd_avx2(auVar7,auVar8);
                auVar7 = vpmaxsd_avx2(ZEXT1632(auVar5),ZEXT1632(auVar11));
                auVar8 = vpmaxsd_avx2(auVar28,auVar36._0_32_);
                auVar7 = vpminsd_avx2(auVar7,(undefined1  [32])local_59a0);
                auVar7 = vpminsd_avx2(auVar32,auVar7);
                auVar8 = vcmpps_avx(auVar8,auVar7,2);
                uVar12 = uVar13;
                auVar7 = auVar19;
                if (((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar8 >> 0x7f,0) != '\0') ||
                       (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar8 >> 0xbf,0) != '\0') ||
                     (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar8[0x1f] < '\0') &&
                   (auVar7 = vblendvps_avx(auVar38._0_32_,auVar28,auVar8), uVar12 = uVar3,
                   uVar13 != 8)) {
                  *puVar17 = uVar13;
                  puVar17 = puVar17 + 1;
                  *pauVar16 = auVar19;
                  pauVar16 = pauVar16 + 1;
                }
                auVar19 = auVar7;
                uVar13 = uVar12;
              }
              uVar15 = uVar13;
            } while (uVar13 != 8);
          }
          goto LAB_016b2641;
        }
LAB_016b28a1:
        auVar19 = vpand_avx2(local_58c0,local_5960);
        auVar23._8_4_ = 0xff800000;
        auVar23._0_8_ = 0xff800000ff800000;
        auVar23._12_4_ = 0xff800000;
        auVar23._16_4_ = 0xff800000;
        auVar23._20_4_ = 0xff800000;
        auVar23._24_4_ = 0xff800000;
        auVar23._28_4_ = 0xff800000;
        auVar19 = vmaskmovps_avx(auVar19,auVar23);
        *(undefined1 (*) [32])local_59b8 = auVar19;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    prim = local_59a8;
    local_59a8 = local_59a8 + 1;
    local_5980 = aVar18;
    InstanceIntersectorK<8>::occluded
              ((vbool<8> *)&local_5840.field_1,(vbool<8> *)&local_5980.field_1,&local_59b9,ray,
               context,prim);
    aVar18.v = (__m256)vandnps_avx(local_5840.v,local_5980.v);
    auVar19 = (undefined1  [32])local_5980 & ~(undefined1  [32])local_5840;
    ray = local_59b0;
    aVar22 = local_5840;
    if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar19 >> 0x7f,0) == '\0') &&
          (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar19 >> 0xbf,0) == '\0') &&
        (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar19[0x1f])
    break;
LAB_016b27e3:
    lVar14 = lVar14 + -1;
    if (lVar14 == 0) break;
  }
  auVar19 = vpcmpeqd_avx2((undefined1  [32])aVar22,(undefined1  [32])aVar22);
  local_58c0 = vpor_avx2(local_58c0,(undefined1  [32])aVar18 ^ auVar19);
  auVar37 = ZEXT3264(local_58c0);
  auVar19 = auVar19 & ~local_58c0;
  if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar19 >> 0x7f,0) == '\0') &&
        (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar19 >> 0xbf,0) == '\0') &&
      (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar19[0x1f])
  goto LAB_016b28a1;
  auVar19._8_4_ = 0xff800000;
  auVar19._0_8_ = 0xff800000ff800000;
  auVar19._12_4_ = 0xff800000;
  auVar19._16_4_ = 0xff800000;
  auVar19._20_4_ = 0xff800000;
  auVar19._24_4_ = 0xff800000;
  auVar19._28_4_ = 0xff800000;
  local_59a0.v = (__m256)vblendvps_avx(local_59a0.v,auVar19,local_58c0);
  auVar33 = ZEXT3264(local_58e0);
  auVar34 = ZEXT3264(local_5900);
  auVar35 = ZEXT3264(local_5920);
  auVar38 = ZEXT3264(CONCAT428(0x7f800000,
                               CONCAT424(0x7f800000,
                                         CONCAT420(0x7f800000,
                                                   CONCAT416(0x7f800000,
                                                             CONCAT412(0x7f800000,
                                                                       CONCAT48(0x7f800000,
                                                                                0x7f8000007f800000))
                                                            )))));
  auVar36 = ZEXT3264(local_5940);
  goto LAB_016b2641;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }